

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::PopAndCheck1Type(TypeChecker *this,Type expected,char *desc)

{
  Result RVar1;
  char *desc_local;
  TypeChecker *this_local;
  Type expected_local;
  Result result;
  
  Result::Result((Result *)&expected_local,Ok);
  RVar1 = PeekAndCheckType(this,0,expected);
  Result::operator|=((Result *)&expected_local,RVar1);
  PrintStackIfFailed<wabt::Type>(this,(Result)expected_local.enum_,desc,expected);
  RVar1 = DropTypes(this,1);
  Result::operator|=((Result *)&expected_local,RVar1);
  return (Result)expected_local.enum_;
}

Assistant:

Result TypeChecker::PopAndCheck1Type(Type expected, const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected);
  PrintStackIfFailed(result, desc, expected);
  result |= DropTypes(1);
  return result;
}